

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

void __thiscall spvtools::opt::BasicBlock::KillAllInsts(BasicBlock *this,bool killLabel)

{
  anon_class_1_1_b75744d6 local_39;
  function<void_(spvtools::opt::Instruction_*)> local_38;
  undefined1 local_11;
  BasicBlock *pBStack_10;
  bool killLabel_local;
  BasicBlock *this_local;
  
  local_39.killLabel = killLabel;
  local_11 = killLabel;
  pBStack_10 = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::BasicBlock::KillAllInsts(bool)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_38,&local_39);
  ForEachInst(this,&local_38,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_38);
  return;
}

Assistant:

void BasicBlock::KillAllInsts(bool killLabel) {
  ForEachInst([killLabel](Instruction* ip) {
    if (killLabel || ip->opcode() != spv::Op::OpLabel) {
      ip->context()->KillInst(ip);
    }
  });
}